

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringView.h
# Opt level: O1

BasicStringView<const_char> __thiscall
Corrade::Containers::BasicStringView<const_char>::slice
          (BasicStringView<const_char> *this,size_t begin,size_t end)

{
  ulong uVar1;
  ulong uVar2;
  BasicStringView<const_char> BVar3;
  ulong local_38;
  size_t local_30;
  anon_class_24_3_cb5dd4a3 local_28;
  
  local_28.end = &local_38;
  local_38 = end;
  local_30 = begin;
  if ((end < begin) || ((this->_sizePlusFlags & 0x3fffffffffffffff) < end)) {
    local_28.begin = &local_30;
    local_28.this = this;
    slice::anon_class_24_3_cb5dd4a3::operator()(&local_28);
  }
  BVar3._data = this->_data + local_30;
  uVar1 = this->_sizePlusFlags;
  uVar2 = 0;
  if (local_38 == (uVar1 & 0x3fffffffffffffff)) {
    uVar2 = uVar1 & 0x4000000000000000;
  }
  BVar3._sizePlusFlags = uVar2 | uVar1 & 0x8000000000000000 | local_38 - local_30;
  return BVar3;
}

Assistant:

constexpr BasicStringView<T> BasicStringView<T>::slice(const std::size_t begin, const std::size_t end) const {
    return CORRADE_CONSTEXPR_DEBUG_ASSERT(begin <= end && end <= (_sizePlusFlags & ~Implementation::StringViewSizeMask),
            "Containers::StringView::slice(): slice ["
            << Utility::Debug::nospace << begin
            << Utility::Debug::nospace << ":"
            << Utility::Debug::nospace << end
            << Utility::Debug::nospace << "] out of range for"
            << (_sizePlusFlags & ~Implementation::StringViewSizeMask) << "elements"),
        BasicStringView<T>{_data + begin, (end - begin)|
            /* Propagate the global flag always */
            (_sizePlusFlags & std::size_t(StringViewFlag::Global))|
            /* The null termination flag only if the original is
               null-terminated and end points to the original end */
            ((_sizePlusFlags & std::size_t(StringViewFlag::NullTerminated))*(end == (_sizePlusFlags & ~Implementation::StringViewSizeMask))),
            /* Using an internal assert-less constructor, the public
               constructor asserts would be redundant */
            nullptr};
}